

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

int query_objlist(char *qstr,obj *olist,int qflags,object_pick **pick_list,int how,
                 _func_boolean_obj_ptr *allow)

{
  int iVar1;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  nh_objresult *pick_list_00;
  object_pick *poVar6;
  int iVar7;
  code *__compar;
  uint uVar8;
  uint uVar9;
  long lVar11;
  int iVar12;
  obj *poVar13;
  long lVar14;
  obj *poVar15;
  ulong uVar16;
  bool bVar17;
  uint local_64;
  undefined8 *local_60;
  nh_objitem *local_58;
  char *local_50;
  int local_44;
  object_pick **local_40;
  char *local_38;
  ulong uVar10;
  
  *pick_list = (object_pick *)0x0;
  uVar8 = qflags & 0x80;
  uVar9 = uVar8 >> 7;
  if (uVar9 == 0) {
    poVar13 = (obj *)0x0;
  }
  else {
    poVar13 = &zeroobj;
  }
  uVar16 = (ulong)(qflags * 8 & 8);
  local_44 = how;
  local_40 = pick_list;
  local_38 = qstr;
  for (poVar15 = olist; uVar10 = (ulong)uVar9, poVar15 != (obj *)0x0;
      poVar15 = *(obj **)((long)poVar15->oextra + (uVar16 - 100))) {
    bVar2 = (*allow)(poVar15);
    if (bVar2 != '\0') {
      poVar13 = poVar15;
    }
    uVar9 = uVar9 + (bVar2 != '\0');
  }
  if (uVar9 == 1) {
    if ((qflags & 2U) != 0) {
      poVar6 = (object_pick *)malloc(0x10);
      *local_40 = poVar6;
      poVar6->obj = poVar13;
      iVar7 = 1;
      if (poVar13 != &zeroobj) {
        iVar7 = poVar13->quan;
      }
      poVar6->count = iVar7;
      return 1;
    }
  }
  else if (uVar9 == 0) {
    return (qflags << 0x1b) >> 0x1f;
  }
  local_60 = (undefined8 *)malloc(uVar10 << 3);
  if (uVar8 != 0) {
    *local_60 = &zeroobj;
  }
  uVar9 = (uint)(uVar8 != 0);
  local_50 = flags.inv_order;
  while( true ) {
    lVar14 = (long)(int)uVar9;
    if (olist == (obj *)0x0) {
      if (((qflags & 8U) != 0) && (uVar4 = (uVar9 - 1) + (uint)(uVar8 == 0), 0 < (int)uVar4)) {
        if ((qflags & 4U) == 0) {
          __compar = obj_compare;
        }
        else {
          __compar = invo_obj_compare;
        }
        qsort((void *)((long)local_60 + (ulong)(uVar8 >> 4)),(ulong)uVar4,8,__compar);
      }
      local_64 = uVar9;
      local_58 = (nh_objitem *)malloc(lVar14 * 0x124);
      if (uVar8 == 0) {
        lVar11 = 0;
        uVar8 = 0;
      }
      else {
        bVar17 = (qflags & 8U) != 0;
        if (bVar17) {
          add_objitem(&local_58,(int *)&local_64,MI_HEADING,0,0,"Furniture",(obj *)0x0,'\0');
        }
        uVar9 = (uint)bVar17;
        uVar8 = uVar9 + 1;
        add_objitem(&local_58,(int *)&local_64,MI_NORMAL,uVar9,1,"a magic chest",&zeroobj,'\0');
        lVar11 = 1;
      }
      cVar3 = -1;
      local_50 = (char *)(ulong)((byte)((uint)qflags >> 2) & 1);
      while (lVar11 < lVar14) {
        poVar13 = (obj *)local_60[lVar11];
        uVar9 = uVar8;
        if (((qflags & 8U) != 0) && (cVar3 != poVar13->oclass)) {
          uVar9 = uVar8 + 1;
          pcVar5 = let_to_name(poVar13->oclass,'\0');
          add_objitem(&local_58,(int *)&local_64,MI_HEADING,uVar8,0,pcVar5,poVar13,'\0');
        }
        examine_object(poVar13);
        uVar8 = uVar9 + 1;
        lVar11 = lVar11 + 1;
        pcVar5 = doname(poVar13);
        add_objitem(&local_58,(int *)&local_64,MI_NORMAL,uVar9,(int)lVar11,pcVar5,poVar13,
                    (boolean)local_50);
        cVar3 = poVar13->oclass;
      }
      if ((int)uVar8 < 1) {
        pick_list_00 = (nh_objresult *)0x0;
      }
      else {
        pick_list_00 = (nh_objresult *)malloc((ulong)uVar8 << 3);
        uVar8 = display_objects(local_58,uVar8,local_38,local_44,pick_list_00);
        uVar10 = (ulong)uVar8;
      }
      uVar8 = (uint)uVar10;
      if ((int)uVar8 < 1) {
        bVar17 = (int)uVar8 < 0;
        uVar8 = 0;
        if (bVar17) {
          uVar8 = (qflags << 0x1a) >> 0x1f & 0xfffffffe;
        }
      }
      else {
        poVar6 = (object_pick *)malloc(uVar10 << 4);
        *local_40 = poVar6;
        for (lVar14 = 0; uVar10 << 3 != lVar14; lVar14 = lVar14 + 8) {
          lVar11 = local_60[(long)*(int *)((long)&pick_list_00->id + lVar14) + -1];
          *(long *)((long)&poVar6->obj + lVar14 * 2) = lVar11;
          iVar7 = *(int *)((long)&pick_list_00->count + lVar14);
          iVar1 = *(int *)(lVar11 + 0x30);
          iVar12 = iVar1;
          if (iVar7 < iVar1) {
            iVar12 = iVar7;
          }
          if (iVar7 == -1) {
            iVar12 = iVar1;
          }
          poVar6 = *local_40;
          *(int *)((long)&poVar6->count + lVar14 * 2) = iVar12;
        }
      }
      free(pick_list_00);
      free(local_60);
      free(local_58);
      return uVar8;
    }
    if (((((qflags & 0x40U) != 0) && (olist->otyp == 0x10e)) &&
        (bVar2 = will_feel_cockatrice(olist,'\0'), bVar2 != '\0')) &&
       (u.uprops[0x21].intrinsic == 0)) break;
    if ((((qflags & 8U) == 0) ||
        (pcVar5 = strchr(local_50,(int)olist->oclass), pcVar5 != (char *)0x0)) &&
       (bVar2 = (*allow)(olist), bVar2 != '\0')) {
      uVar9 = uVar9 + 1;
      local_60[lVar14] = olist;
    }
    olist = *(obj **)((long)olist->oextra + (uVar16 - 100));
  }
  free(local_60);
  look_here(0,'\0');
  return 0;
}

Assistant:

int query_objlist(const char *qstr,	/* query string */
		  struct obj *olist,	/* the list to pick from */
		  int qflags,		/* options to control the query */
		  struct object_pick **pick_list,/* return list of items picked */
		  int how,		/* type of query */
		  boolean (*allow)(const struct obj*)) /* allow function */
{
	int n = 0, i, prev_oclass, nr_objects;
	struct obj *curr, *last;
	int nr_items = 0, cur_entry = 0;
	struct nh_objitem *items = NULL;
	struct obj **objlist = NULL;
	struct nh_objresult *selection = NULL;

	*pick_list = NULL;

	/* count the number of items allowed */
	n = 0;
	last = 0;
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* &zeroobj indicates the selection of the 'magic chest' entry */
	    last = &zeroobj;
	    n++;
	}
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((*allow)(curr)) {
		last = curr;
		n++;
	    }
	}

	if (n == 0)	/* nothing to pick here */
	    return (qflags & SIGNAL_NOMENU) ? -1 : 0;

	if (n == 1 && (qflags & AUTOSELECT_SINGLE)) {
	    *pick_list = malloc(sizeof(struct object_pick));
	    (*pick_list)->obj = last;
	    /* For a magic chest, use a valid but arbitrary count. */
	    (*pick_list)->count = cobj_is_magic_chest(last) ? 1 : last->quan;
	    return 1;
	}

	/* add all allowed objects to the list */
	nr_objects = 0;
	objlist = malloc(n * sizeof(struct obj*));
	if (qflags & SHOW_MAGIC_CHEST)
	    objlist[nr_objects++] = &zeroobj;
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((qflags & FEEL_COCKATRICE) && curr->otyp == CORPSE &&
		    will_feel_cockatrice(curr, FALSE) && !Stoned) {
		    free(objlist);
		    look_here(0, FALSE);
		    return 0;
	    }
	    if ((!(qflags & INVORDER_SORT) || strchr(flags.inv_order, curr->oclass))
		&& (*allow)(curr))
		objlist[nr_objects++] = curr;
	}

	/* sort the list in place according to (1) inv_order and... */
	if (qflags & INVORDER_SORT) {
	    struct obj **tmp_objlist = objlist;
	    int tmp_nr_objects = nr_objects;
	    int (*objcmp_func)(const void *, const void *) =
		(qflags & USE_INVLET) ?
		    invo_obj_compare :	/* ... (2) only inv_order. */
		    obj_compare;	/* ... (2) object name. */
	    if (qflags & SHOW_MAGIC_CHEST) {
		/* Don't move 'magic chest' entry away from the top. */
		tmp_objlist++;
		tmp_nr_objects--;
	    }
	    if (tmp_nr_objects > 0)
		qsort(tmp_objlist, tmp_nr_objects, sizeof(struct obj *), objcmp_func);
	}

	/* nr_items will be greater than nr_objects, because it counts headers, too */
	nr_items = nr_objects;
	items = malloc(nr_items * sizeof(struct nh_objitem));
	prev_oclass = -1;
	cur_entry = 0;
	i = 0;
	/* magic chest comes first if it was requested */
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* fudge the entries for 'magic chest' */
	    if (qflags & INVORDER_SORT) {
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
			    "Furniture", NULL, FALSE);
	    }
	    /* &zeroobj is handled specially by add_objitem */
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
			"a magic chest", &zeroobj, FALSE);
	    i++;
	}
	/* now go through the objects proper */
	for (; i < nr_objects; i++) {
	    curr = objlist[i];
	    /* if sorting, print type name */
	    if ((qflags & INVORDER_SORT) && prev_oclass != curr->oclass)
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
		            let_to_name(curr->oclass, FALSE), curr, FALSE);
	    /* add the object to the list */
	    examine_object(curr);
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
	                doname(curr), curr, (qflags & USE_INVLET) != 0);
	    prev_oclass = curr->oclass;
	}

	if (cur_entry > 0) {
	    selection = malloc(cur_entry * sizeof(struct nh_objresult));
	    n = display_objects(items, cur_entry, qstr, how, selection);
	}

	if (n > 0) {
	    *pick_list = malloc(n * sizeof(struct object_pick));

	    for (i = 0; i < n; i++) {
		curr = objlist[selection[i].id - 1];
		(*pick_list)[i].obj = curr;
		if (selection[i].count == -1 || selection[i].count > curr->quan)
		    (*pick_list)[i].count = curr->quan;
		else
		    (*pick_list)[i].count = selection[i].count;
	    }
	} else if (n < 0) {
	    /* callers don't expect -1 by this point */
	    n = (qflags & SIGNAL_ESCAPE) ? -2 : 0;
	}
	free(selection);
	free(objlist);
	free(items);

	return n;
}